

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mt.cpp
# Opt level: O2

void __thiscall testMt::test_method(testMt *this)

{
  int iVar1;
  bool bVar2;
  text_oarchive oa;
  System aSystem;
  _Vector_base<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>
  local_300 [240];
  ofstream ofs;
  
  dynamicgraph::CPU::System::System(&aSystem);
  std::ofstream::ofstream(&ofs,"cpu_state.dat",_S_out);
  boost::archive::text_oarchive::text_oarchive(&oa,(ostream *)&ofs,0);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<dynamicgraph::CPU::System>(&oa,&aSystem);
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    usleep(100000);
    dynamicgraph::CPU::System::readProcStat();
  }
  boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
            (&oa.super_text_oarchive_impl<boost::archive::text_oarchive>);
  std::ofstream::~ofstream(&ofs);
  std::_Vector_base<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>::
  ~_Vector_base(local_300);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testMt) {
  dynamicgraph::CPU::System aSystem;

  // create and open a character archive for output
  std::ofstream ofs("cpu_state.dat");
  boost::archive::text_oarchive oa(ofs);
  oa << aSystem;

  for (unsigned int i = 0; i < 10; i++) {
    usleep(100000);
    aSystem.readProcStat();
  }
}